

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::
     encode_traits<std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>,std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>>>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>
                *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  bool bVar1;
  variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
  *val_00;
  error_code *in_RCX;
  basic_json_visitor<char> *in_RSI;
  vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>
  *in_RDI;
  const_iterator it;
  error_code *in_stack_ffffffffffffff88;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_json_visitor<char> *this;
  basic_json_visitor<char> local_50;
  variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
  *local_48;
  __normal_iterator<const_std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_*,_std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>_>
  local_40 [3];
  ser_context local_28;
  error_code *local_20;
  basic_json_visitor<char> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  val_00 = (variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
            *)std::
              vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>
              ::size(in_RDI);
  local_28._vptr_ser_context = (_func_int **)0x0;
  ser_context::ser_context(&local_28);
  basic_json_visitor<char>::begin_array
            ((basic_json_visitor<char> *)val_00,(size_t)in_RSI,
             (semantic_tag)((ulong)in_stack_ffffffffffffff90 >> 0x38),
             (ser_context *)in_stack_ffffffffffffff88,(error_code *)0xc30b54);
  ser_context::~ser_context(&local_28);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    local_40[0]._M_current =
         (variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
          *)std::
            begin<std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>,std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>>>>
                      ((vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>
                        *)in_stack_ffffffffffffff88);
    while( true ) {
      local_48 = (variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>
                  *)std::
                    end<std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>,std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>>>>
                              ((vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>
                                *)in_stack_ffffffffffffff88);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_*,_std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<const_std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_*,_std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_*,_std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>_>
      ::operator*(local_40);
      encode_traits<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,(anonymous_namespace)::ns::Triangle_NGSN,(anonymous_namespace)::ns::Circle_NGSN>,char,void>
      ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (val_00,in_RSI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_*,_std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_NGSN,_(anonymous_namespace)::ns::Triangle_NGSN,_(anonymous_namespace)::ns::Circle_NGSN>_>_>_>
      ::operator++(local_40);
    }
    local_50._vptr_basic_json_visitor = (_func_int **)0x0;
    this = &local_50;
    ser_context::ser_context((ser_context *)this);
    basic_json_visitor<char>::end_array(this,(ser_context *)local_10,(error_code *)0xc30c42);
    ser_context::~ser_context((ser_context *)&local_50);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(val.size(),semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encode_traits<value_type,CharT>::encode(*it, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_array(ser_context(), ec);
        }